

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

int main(void)

{
  SplayTree *this;
  iterator iVar1;
  char cVar2;
  int iVar3;
  Node *pNVar4;
  ostream *poVar5;
  long *plVar6;
  int *piVar7;
  undefined8 uVar8;
  long *plVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string line_1;
  SplayTree sTree;
  string path;
  string dataset;
  SplayTree sTree_1;
  string count_of_elements;
  string operation;
  SplayTree sTree_2;
  string line;
  size_type __dnew;
  long *local_5b0;
  long local_5a8;
  long local_5a0;
  long lStack_598;
  long *local_590;
  long local_588;
  long local_580;
  long lStack_578;
  long *local_570;
  long local_568;
  long local_560;
  long lStack_558;
  long *local_550;
  long local_548;
  long local_540;
  long lStack_538;
  long *local_530;
  char *local_528;
  long local_520;
  long lStack_518;
  SplayTree local_510 [2];
  Node local_500;
  long local_4e0;
  undefined1 local_4d8 [16];
  Node *local_4c8;
  undefined1 local_4b8 [24];
  iterator iStack_4a0;
  int *local_498;
  long *local_490 [2];
  long local_480 [2];
  long *local_470 [2];
  long local_460 [2];
  undefined8 local_450;
  SplayTree local_448;
  long *local_440;
  long local_438;
  long local_430;
  long lStack_428;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_500.right_child = (Node *)local_4d8;
  local_238[0] = 0x82;
  pNVar4 = (Node *)std::__cxx11::string::_M_create((ulong *)&local_500.right_child,(ulong)local_238)
  ;
  lVar12 = local_238[0];
  local_4d8._0_8_ = local_238[0];
  local_500.right_child = pNVar4;
  memcpy(pNVar4,
         "/workspace/llm4binary/github/license_all_cmakelists_25/Algorithms-and-Data-Structures-2021[P]semester-work-splay-tree/dataset/data"
         ,0x82);
  local_4e0 = lVar12;
  *(char *)((long)&pNVar4->data + lVar12) = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Path to the \'dataset/\' folder: ",0x1f);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_500.right_child,local_4e0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_470[0] = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"remove","");
  local_490[0] = local_480;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"5000000","");
  local_4c8 = (Node *)local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"01","");
  iVar3 = std::__cxx11::string::compare((char *)local_470);
  if (iVar3 == 0) {
    iVar3 = 0;
    do {
      itis::SplayTree::SplayTree(local_510);
      local_440 = &local_430;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"1","");
      local_5b0 = &local_5a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5b0,local_500.right_child,
                 (char *)((long)&(local_500.right_child)->data + local_4e0));
      std::__cxx11::string::append((char *)&local_5b0);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_4c8);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_560 = *plVar9;
        lStack_558 = plVar6[3];
        local_570 = &local_560;
      }
      else {
        local_560 = *plVar9;
        local_570 = (long *)*plVar6;
      }
      local_568 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_570);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_540 = *plVar9;
        lStack_538 = plVar6[3];
        local_550 = &local_540;
      }
      else {
        local_540 = *plVar9;
        local_550 = (long *)*plVar6;
      }
      local_548 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_550,(ulong)local_490[0]);
      local_590 = &local_580;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_580 = *plVar9;
        lStack_578 = plVar6[3];
      }
      else {
        local_580 = *plVar9;
        local_590 = (long *)*plVar6;
      }
      local_588 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_590);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_520 = *plVar9;
        lStack_518 = plVar6[3];
        local_530 = &local_520;
      }
      else {
        local_520 = *plVar9;
        local_530 = (long *)*plVar6;
      }
      local_528 = (char *)plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::ifstream::ifstream(local_238,(string *)&local_530,_S_in);
      if (local_530 != &local_520) {
        operator_delete(local_530,local_520 + 1);
      }
      if (local_590 != &local_580) {
        operator_delete(local_590,local_580 + 1);
      }
      if (local_550 != &local_540) {
        operator_delete(local_550,local_540 + 1);
      }
      local_500.left_child = (Node *)CONCAT44(local_500.left_child._4_4_,iVar3);
      if (local_570 != &local_560) {
        operator_delete(local_570,local_560 + 1);
      }
      if (local_5b0 != &local_5a0) {
        operator_delete(local_5b0,local_5a0 + 1);
      }
      std::chrono::_V2::steady_clock::now();
      if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
        while (iVar3 = std::__cxx11::string::compare((char *)&local_440), iVar3 != 0) {
          cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_238,(string *)&local_440,cVar2);
          iVar3 = std::__cxx11::string::compare((char *)&local_440);
          plVar6 = local_440;
          if (iVar3 == 0) break;
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          *piVar7 = 0;
          lVar12 = strtol((char *)plVar6,(char **)&local_530,10);
          if (local_530 == plVar6) goto LAB_001038d4;
          if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_001038e0;
          if (*piVar7 == 0) {
            *piVar7 = iVar3;
          }
          itis::SplayTree::insert(local_510,(int)lVar12);
        }
      }
      std::chrono::_V2::steady_clock::now();
      std::ifstream::close();
      poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::ifstream::~ifstream(local_238);
      iVar3 = (int)local_500.left_child;
      if (local_440 != &local_430) {
        operator_delete(local_440,local_430 + 1);
      }
      itis::SplayTree::~SplayTree(local_510);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 10);
  }
  iVar3 = std::__cxx11::string::compare((char *)local_470);
  if (iVar3 == 0) {
    pNVar4 = (Node *)0x0;
    this = (SplayTree *)(local_4b8 + 0x10);
    do {
      local_500.left_child = pNVar4;
      itis::SplayTree::SplayTree(this);
      local_440 = &local_430;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_440,local_500.right_child,
                 (char *)((long)&(local_500.right_child)->data + local_4e0));
      std::__cxx11::string::append((char *)&local_440);
      std::ifstream::ifstream(local_238,(string *)&local_440,_S_in);
      if (local_440 != &local_430) {
        operator_delete(local_440,local_430 + 1);
      }
      local_530 = &local_520;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"1","");
      if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
        while (iVar3 = std::__cxx11::string::compare((char *)&local_530), iVar3 != 0) {
          cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_238,(string *)&local_530,cVar2);
          iVar3 = std::__cxx11::string::compare((char *)&local_530);
          plVar6 = local_530;
          if (iVar3 == 0) break;
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          *piVar7 = 0;
          lVar12 = strtol((char *)plVar6,(char **)&local_440,10);
          if (local_440 == plVar6) goto LAB_001038ec;
          if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_001038f8;
          if (*piVar7 == 0) {
            *piVar7 = iVar3;
          }
          itis::SplayTree::insert(this,(int)lVar12);
        }
      }
      std::ifstream::close();
      local_510[0].root = &local_500;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_510,local_500.right_child,
                 (char *)((long)&(local_500.right_child)->data + local_4e0));
      std::__cxx11::string::append((char *)local_510);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_510,(ulong)local_4c8);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_5a0 = *plVar9;
        lStack_598 = plVar6[3];
        local_5b0 = &local_5a0;
      }
      else {
        local_5a0 = *plVar9;
        local_5b0 = (long *)*plVar6;
      }
      local_5a8 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_5b0);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_560 = *plVar9;
        lStack_558 = plVar6[3];
        local_570 = &local_560;
      }
      else {
        local_560 = *plVar9;
        local_570 = (long *)*plVar6;
      }
      local_568 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_570,(ulong)local_490[0]);
      local_550 = &local_540;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_540 = *plVar9;
        lStack_538 = plVar6[3];
      }
      else {
        local_540 = *plVar9;
        local_550 = (long *)*plVar6;
      }
      local_548 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_550);
      local_590 = &local_580;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_580 = *plVar9;
        lStack_578 = plVar6[3];
      }
      else {
        local_580 = *plVar9;
        local_590 = (long *)*plVar6;
      }
      local_588 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::ifstream::ifstream((ifstream *)&local_440,(string *)&local_590,_S_in);
      std::ifstream::operator=(local_238,(ifstream *)&local_440);
      std::ifstream::~ifstream((ifstream *)&local_440);
      if (local_590 != &local_580) {
        operator_delete(local_590,local_580 + 1);
      }
      if (local_550 != &local_540) {
        operator_delete(local_550,local_540 + 1);
      }
      if (local_570 != &local_560) {
        operator_delete(local_570,local_560 + 1);
      }
      if (local_5b0 != &local_5a0) {
        operator_delete(local_5b0,local_5a0 + 1);
      }
      if (local_510[0].root != &local_500) {
        operator_delete(local_510[0].root,local_500._0_8_ + 1);
      }
      std::__cxx11::string::_M_replace((ulong)&local_530,0,local_528,0x105034);
      local_450 = std::chrono::_V2::steady_clock::now();
      if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
        while (iVar3 = std::__cxx11::string::compare((char *)&local_530), iVar3 != 0) {
          cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_238,(string *)&local_530,cVar2);
          iVar3 = std::__cxx11::string::compare((char *)&local_530);
          plVar6 = local_530;
          if (iVar3 == 0) break;
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          *piVar7 = 0;
          lVar12 = strtol((char *)plVar6,(char **)&local_440,10);
          if (local_440 == plVar6) goto LAB_00103904;
          if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_00103910;
          if (*piVar7 == 0) {
            *piVar7 = iVar3;
          }
          itis::SplayTree::search(this,(int)lVar12);
        }
      }
      std::chrono::_V2::steady_clock::now();
      std::ifstream::close();
      poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      pNVar4 = local_500.left_child;
      if (local_530 != &local_520) {
        operator_delete(local_530,local_520 + 1);
      }
      std::ifstream::~ifstream(local_238);
      itis::SplayTree::~SplayTree(this);
      uVar11 = (int)pNVar4 + 1;
      pNVar4 = (Node *)(ulong)uVar11;
    } while (uVar11 != 10);
  }
  iVar3 = std::__cxx11::string::compare((char *)local_470);
  if (iVar3 == 0) {
    local_530 = &local_520;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"1","");
    local_5b0 = &local_5a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5b0,local_500.right_child,
               (char *)((long)&(local_500.right_child)->data + local_4e0));
    std::__cxx11::string::append((char *)&local_5b0);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_5b0,(ulong)local_4c8);
    local_570 = &local_560;
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_560 = *plVar9;
      lStack_558 = plVar6[3];
    }
    else {
      local_560 = *plVar9;
      local_570 = (long *)*plVar6;
    }
    local_568 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_570);
    local_550 = &local_540;
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_540 = *plVar9;
      lStack_538 = plVar6[3];
    }
    else {
      local_540 = *plVar9;
      local_550 = (long *)*plVar6;
    }
    local_548 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_550,(ulong)local_490[0]);
    local_590 = &local_580;
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_580 = *plVar9;
      lStack_578 = plVar6[3];
    }
    else {
      local_580 = *plVar9;
      local_590 = (long *)*plVar6;
    }
    local_588 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_590);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_430 = *plVar9;
      lStack_428 = plVar6[3];
      local_440 = &local_430;
    }
    else {
      local_430 = *plVar9;
      local_440 = (long *)*plVar6;
    }
    local_438 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::ifstream::ifstream((istream *)local_238,(string *)&local_440,_S_in);
    if (local_440 != &local_430) {
      operator_delete(local_440,local_430 + 1);
    }
    if (local_590 != &local_580) {
      operator_delete(local_590,local_580 + 1);
    }
    if (local_550 != &local_540) {
      operator_delete(local_550,local_540 + 1);
    }
    if (local_570 != &local_560) {
      operator_delete(local_570,local_560 + 1);
    }
    if (local_5b0 != &local_5a0) {
      operator_delete(local_5b0,local_5a0 + 1);
    }
    local_4b8._16_8_ = (Node *)0x0;
    iStack_4a0._M_current = (int *)0x0;
    local_498 = (int *)0x0;
    if (((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) &&
       (iVar3 = std::__cxx11::string::compare((char *)&local_530), iVar3 != 0)) {
      do {
        cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_530,cVar2);
        iVar3 = std::__cxx11::string::compare((char *)&local_530);
        plVar6 = local_530;
        if (iVar3 == 0) break;
        piVar7 = __errno_location();
        iVar3 = *piVar7;
        *piVar7 = 0;
        lVar12 = strtol((char *)plVar6,(char **)&local_440,10);
        if (local_440 == plVar6) goto LAB_00103928;
        if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_0010391c;
        if (*piVar7 == 0) {
          *piVar7 = iVar3;
        }
        local_590 = (long *)CONCAT44(local_590._4_4_,(int)lVar12);
        if (iStack_4a0._M_current == local_498) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)(local_4b8 + 0x10),iStack_4a0,
                     (int *)&local_590);
        }
        else {
          *iStack_4a0._M_current = (int)lVar12;
          iStack_4a0._M_current = iStack_4a0._M_current + 1;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_530);
      } while (iVar3 != 0);
    }
    std::ifstream::close();
    iVar1._M_current = iStack_4a0._M_current;
    uVar8 = local_4b8._16_8_;
    if (((int *)local_4b8._16_8_ != iStack_4a0._M_current) &&
       ((int *)(local_4b8._16_8_ + 4) != iStack_4a0._M_current)) {
      lVar12 = 4;
      do {
        iVar3 = rand();
        lVar10 = (long)iVar3 % ((lVar12 >> 2) + 1);
        if (lVar12 != lVar10 * 4) {
          piVar7 = (int *)((long)(int *)uVar8 + lVar12);
          iVar3 = *piVar7;
          *piVar7 = ((int *)uVar8)[lVar10];
          ((int *)uVar8)[lVar10] = iVar3;
        }
        pNVar4 = (Node *)((undefined1 *)(uVar8 + 4) + lVar12);
        lVar12 = lVar12 + 4;
      } while (pNVar4 != (Node *)iVar1._M_current);
    }
    pNVar4 = (Node *)0x0;
    do {
      itis::SplayTree::SplayTree(&local_448);
      local_510[0].root = &local_500;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_510,local_500.right_child,
                 (char *)((long)&(local_500.right_child)->data + local_4e0));
      std::__cxx11::string::append((char *)local_510);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_510,(ulong)local_4c8);
      local_5b0 = &local_5a0;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_5a0 = *plVar9;
        lStack_598 = plVar6[3];
      }
      else {
        local_5a0 = *plVar9;
        local_5b0 = (long *)*plVar6;
      }
      local_5a8 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_5b0);
      local_570 = &local_560;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_560 = *plVar9;
        lStack_558 = plVar6[3];
      }
      else {
        local_560 = *plVar9;
        local_570 = (long *)*plVar6;
      }
      local_568 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_570,(ulong)local_490[0]);
      local_550 = &local_540;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_540 = *plVar9;
        lStack_538 = plVar6[3];
      }
      else {
        local_540 = *plVar9;
        local_550 = (long *)*plVar6;
      }
      local_548 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_550);
      local_590 = &local_580;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_580 = *plVar9;
        lStack_578 = plVar6[3];
      }
      else {
        local_580 = *plVar9;
        local_590 = (long *)*plVar6;
      }
      local_588 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::ifstream::ifstream(&local_440,(string *)&local_590,_S_in);
      if (local_590 != &local_580) {
        operator_delete(local_590,local_580 + 1);
      }
      if (local_550 != &local_540) {
        operator_delete(local_550,local_540 + 1);
      }
      if (local_570 != &local_560) {
        operator_delete(local_570,local_560 + 1);
      }
      if (local_5b0 != &local_5a0) {
        operator_delete(local_5b0,local_5a0 + 1);
      }
      if (local_510[0].root != &local_500) {
        operator_delete(local_510[0].root,local_500._0_8_ + 1);
      }
      std::__cxx11::string::_M_replace((ulong)&local_530,0,local_528,0x105034);
      local_500.left_child = pNVar4;
      while( true ) {
        iVar3 = std::__cxx11::string::compare((char *)&local_530);
        if (iVar3 == 0) break;
        cVar2 = std::ios::widen((char)local_440[-3] + (char)(istream *)&local_440);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_440,(string *)&local_530,cVar2);
        iVar3 = std::__cxx11::string::compare((char *)&local_530);
        plVar6 = local_530;
        if (iVar3 == 0) break;
        piVar7 = __errno_location();
        iVar3 = *piVar7;
        *piVar7 = 0;
        lVar12 = strtol((char *)plVar6,(char **)&local_590,10);
        if (local_590 == plVar6) {
          std::__throw_invalid_argument("stoi");
LAB_001038c8:
          std::__throw_out_of_range("stoi");
LAB_001038d4:
          std::__throw_invalid_argument("stoi");
LAB_001038e0:
          std::__throw_out_of_range("stoi");
LAB_001038ec:
          std::__throw_invalid_argument("stoi");
LAB_001038f8:
          std::__throw_out_of_range("stoi");
LAB_00103904:
          std::__throw_invalid_argument("stoi");
LAB_00103910:
          std::__throw_out_of_range("stoi");
          goto LAB_0010391c;
        }
        if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_001038c8;
        if (*piVar7 == 0) {
          *piVar7 = iVar3;
        }
        itis::SplayTree::insert(&local_448,(int)lVar12);
      }
      std::ifstream::close();
      std::chrono::_V2::steady_clock::now();
      iVar1._M_current = iStack_4a0._M_current;
      for (pNVar4 = (Node *)local_4b8._16_8_; pNVar4 != (Node *)iVar1._M_current;
          pNVar4 = (Node *)&pNVar4->field_0x4) {
        itis::SplayTree::remove(&local_448,(char *)(ulong)(uint)pNVar4->data);
      }
      std::chrono::_V2::steady_clock::now();
      poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
      pNVar4 = local_500.left_child;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::ifstream::~ifstream(&local_440);
      itis::SplayTree::~SplayTree(&local_448);
      uVar11 = (int)pNVar4 + 1;
      pNVar4 = (Node *)(ulong)uVar11;
    } while (uVar11 != 10);
    if ((Node *)local_4b8._16_8_ != (Node *)0x0) {
      operator_delete((void *)local_4b8._16_8_,(long)local_498 - local_4b8._16_8_);
    }
    std::ifstream::~ifstream(local_238);
    if (local_530 != &local_520) {
      operator_delete(local_530,local_520 + 1);
    }
  }
  if (local_4c8 != (Node *)local_4b8) {
    operator_delete(local_4c8,local_4b8._0_8_ + 1);
  }
  if (local_490[0] != local_480) {
    operator_delete(local_490[0],local_480[0] + 1);
  }
  if (local_470[0] != local_460) {
    operator_delete(local_470[0],local_460[0] + 1);
  }
  if (local_500.right_child != (Node *)local_4d8) {
    operator_delete(local_500.right_child,local_4d8._0_8_ + 1);
  }
  return 0;
LAB_0010391c:
  std::__throw_out_of_range("stoi");
LAB_00103928:
  uVar8 = std::__throw_invalid_argument("stoi");
  if ((Node *)local_4b8._16_8_ != (Node *)0x0) {
    operator_delete((void *)local_4b8._16_8_,(long)local_498 - local_4b8._16_8_);
  }
  std::ifstream::~ifstream(local_238);
  if (local_530 != &local_520) {
    operator_delete(local_530,local_520 + 1);
  }
  if (local_4c8 != (Node *)local_4b8) {
    operator_delete(local_4c8,local_4b8._0_8_ + 1);
  }
  if (local_490[0] != local_480) {
    operator_delete(local_490[0],local_480[0] + 1);
  }
  if (local_470[0] != local_460) {
    operator_delete(local_470[0],local_460[0] + 1);
  }
  if (local_500.right_child != (Node *)local_4d8) {
    operator_delete(local_500.right_child,local_4d8._0_8_ + 1);
  }
  _Unwind_Resume(uVar8);
}

Assistant:

int main() {
  const auto path = string(kDatasetPath);
  cout << "Path to the 'dataset/' folder: " << path << endl;
  // меняете значение переменной operation на ту операцию, которую надо вам проанализировать
  string operation = "remove";
  // в переменной trials - кол-во прогонов
  int trials = 10;
  // ну тут по имени переменной думаю всё понятно
  string count_of_elements = "5000000";
  // номер набора данных, тоже меняете)
  string dataset = "01";
  if (operation == "insert") {
    for (int i = 0; i < trials; i++) {
      SplayTree sTree;
      string line = "1"; // нужна, чтобы прошел первый прогон, так как сначала строка пустая (в следующих операциях точно также)
      // открываем csv файл (в следующих операциях точно также)
      auto input_file = ifstream(path + "/insert/" + dataset + "/" + count_of_elements + ".csv");
      const auto time_point_before = chrono::steady_clock::now();
      // здесь находится участок кода, время которого необходимо замерить
      // заполнение дерева
      if (input_file) {
        while (line != "") {
          getline(input_file, line);
          if (line == "") {
            break;
          }
          sTree.insert(stoi(line)); //используем stoi(string to integer), так как первоначально line имеет тип string
        }
      }
      const auto time_point_after = chrono::steady_clock::now();
      input_file.close();
      const auto time_diff = time_point_after - time_point_before;
      const long time_elapsed_ns = chrono::duration_cast<chrono::nanoseconds>(time_diff).count();
      cout << time_elapsed_ns << endl;
    }
  }
  if (operation == "search") {
    for (int i = 0; i < trials; i++) {
      SplayTree sTree;
      auto input_file = ifstream(path + "/5000000.csv");
      string line = "1";
      // заполнение дерева определенным датасетом с количеством элементов >= количества элемента при поиске
      if (input_file) {
        while (line != "") {
          getline(input_file, line);
          if (line == "") {
            break;
          }
          sTree.insert(stoi(line));
        }
      }
      input_file.close();
      input_file = ifstream(path + "/find/" + dataset + "/" + count_of_elements + ".csv");
      line = "1";
      const auto time_point_before = chrono::steady_clock::now();
      // замер операции поиск
      if (input_file) {
        while (line != "") {
          getline(input_file, line);
          if (line == "") {
            break;
          }
          sTree.search(stoi(line));
        }
      }
      const auto time_point_after = chrono::steady_clock::now();
      input_file.close();
      const auto time_diff = time_point_after - time_point_before;
      const long time_elapsed_ns = chrono::duration_cast<chrono::nanoseconds>(time_diff).count();
      cout << time_elapsed_ns << endl;
    }
  }
  if (operation == "remove") {
    string line = "1";
    auto input_file = ifstream(path + "/remove/" + dataset + "/" + count_of_elements + ".csv");
    // создание вектора
    vector<int> csv;
    //заполнение вектора
    if (input_file) {
      while (line != "") {
        getline(input_file, line);
        if (line == "") {
          break;
        }
        csv.push_back(stoi(line));
      }
    }
    input_file.close();
    //перемешивание вектора
    random_shuffle(csv.begin(), csv.end());
    //прогонка
    for (int i = 0; i < trials; i++) {
      SplayTree sTree;  //создание дерева
      auto input_file = ifstream(path + "/remove/" + dataset + "/" + count_of_elements + ".csv");
      line = "1";
      //заполнение дерева
      while (line != "") {
        getline(input_file, line);
        if (line == "") {
          break;
        }
        sTree.insert(stoi(line));
      }
      input_file.close();
      //замер времени для операции remove
      const auto time_point_before = chrono::steady_clock::now();
      for (int element : csv) {
        sTree.remove(element);
      }
      const auto time_point_after = chrono::steady_clock::now();
      const auto time_diff = time_point_after - time_point_before;
      const long time_elapsed_ns = chrono::duration_cast<chrono::nanoseconds>(time_diff).count();
      cout << time_elapsed_ns << endl;
    }
  }
  return 0;
}